

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.cpp
# Opt level: O1

void vera::blendMode(BlendMode _mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  switch(_mode) {
  case BLEND_NONE:
    glDisable(0xbe2);
    return;
  case BLEND_ALPHA:
    glEnable(0xbe2);
    uVar2 = 0x302;
    break;
  case BLEND_ADD:
    glEnable(0xbe2);
    uVar2 = 0x8006;
    goto LAB_001ffe9f;
  case BLEND_MULTIPLY:
    glEnable(0xbe2);
    glBlendEquation(0x8006);
    uVar2 = 0x306;
    break;
  case BLEND_SCREEN:
    glEnable(0xbe2);
    glBlendEquation(0x8006);
    uVar2 = 0x307;
    goto LAB_001ffea9;
  case BLEND_SUBSTRACT:
    glEnable(0xbe2);
    uVar2 = 0x800b;
LAB_001ffe9f:
    glBlendEquation(uVar2);
    uVar2 = 0x302;
LAB_001ffea9:
    uVar1 = 1;
    goto LAB_001ffeae;
  default:
    return;
  }
  uVar1 = 0x303;
LAB_001ffeae:
  glBlendFunc(uVar2,uVar1);
  return;
}

Assistant:

void blendMode( BlendMode _mode ) {
    switch (_mode) {
        case BLEND_ALPHA:
            glEnable(GL_BLEND);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
            break;

        case BLEND_ADD:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE);
            break;

        case BLEND_MULTIPLY:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA /* GL_ZERO or GL_ONE_MINUS_SRC_ALPHA */);
            break;

        case BLEND_SCREEN:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_ONE_MINUS_DST_COLOR, GL_ONE);
            break;

        case BLEND_SUBSTRACT:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_REVERSE_SUBTRACT);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE);
            break;

        case BLEND_NONE:
            glDisable(GL_BLEND);
            break;

        default:
            break;
    }
}